

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O1

SUNErrCode SUNNonlinSolFree_FixedPoint(SUNNonlinearSolver NLS)

{
  void *pvVar1;
  long lVar2;
  
  if (NLS != (SUNNonlinearSolver)0x0) {
    if (NLS->content != (void *)0x0) {
      if (*(long *)((long)NLS->content + 0x68) != 0) {
        N_VDestroy();
        *(undefined8 *)((long)NLS->content + 0x68) = 0;
      }
      if (*(long *)((long)NLS->content + 0x70) != 0) {
        N_VDestroy();
        *(undefined8 *)((long)NLS->content + 0x70) = 0;
      }
      if (*(long *)((long)NLS->content + 0x78) != 0) {
        N_VDestroy();
        *(undefined8 *)((long)NLS->content + 0x78) = 0;
      }
      if (*(long *)((long)NLS->content + 0x80) != 0) {
        N_VDestroy();
        *(undefined8 *)((long)NLS->content + 0x80) = 0;
      }
      if (*(long *)((long)NLS->content + 0x88) != 0) {
        N_VDestroy();
        *(undefined8 *)((long)NLS->content + 0x88) = 0;
      }
      pvVar1 = *(void **)((long)NLS->content + 0x18);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        *(undefined8 *)((long)NLS->content + 0x18) = 0;
      }
      pvVar1 = *(void **)((long)NLS->content + 0x30);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        *(undefined8 *)((long)NLS->content + 0x30) = 0;
      }
      pvVar1 = *(void **)((long)NLS->content + 0x38);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        *(undefined8 *)((long)NLS->content + 0x38) = 0;
      }
      pvVar1 = *(void **)((long)NLS->content + 0x40);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        *(undefined8 *)((long)NLS->content + 0x40) = 0;
      }
      lVar2 = *(long *)((long)NLS->content + 0x48);
      if (lVar2 != 0) {
        N_VDestroyVectorArray(lVar2,*(undefined4 *)((long)NLS->content + 0x10));
        *(undefined8 *)((long)NLS->content + 0x48) = 0;
      }
      lVar2 = *(long *)((long)NLS->content + 0x50);
      if (lVar2 != 0) {
        N_VDestroyVectorArray(lVar2,*(undefined4 *)((long)NLS->content + 0x10));
        *(undefined8 *)((long)NLS->content + 0x50) = 0;
      }
      lVar2 = *(long *)((long)NLS->content + 0x58);
      if (lVar2 != 0) {
        N_VDestroyVectorArray(lVar2,*(undefined4 *)((long)NLS->content + 0x10));
        *(undefined8 *)((long)NLS->content + 0x58) = 0;
      }
      pvVar1 = *(void **)((long)NLS->content + 0x60);
      if (pvVar1 != (void *)0x0) {
        free(pvVar1);
        *(undefined8 *)((long)NLS->content + 0x60) = 0;
      }
      free(NLS->content);
      NLS->content = (void *)0x0;
    }
    if (NLS->ops != (SUNNonlinearSolver_Ops)0x0) {
      free(NLS->ops);
      NLS->ops = (SUNNonlinearSolver_Ops)0x0;
    }
    free(NLS);
  }
  return 0;
}

Assistant:

SUNErrCode SUNNonlinSolFree_FixedPoint(SUNNonlinearSolver NLS)
{
  /* return if NLS is already free */
  if (NLS == NULL) { return SUN_SUCCESS; }

  /* free items from content structure, then the structure itself */
  if (NLS->content)
  {
    FreeContent(NLS);
    free(NLS->content);
    NLS->content = NULL;
  }

  /* free the ops structure */
  if (NLS->ops)
  {
    free(NLS->ops);
    NLS->ops = NULL;
  }

  /* free the overall NLS structure */
  free(NLS);

  return SUN_SUCCESS;
}